

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void __thiscall double_conversion::StringBuilder::AddString(StringBuilder *this,char *s)

{
  size_t sVar1;
  
  sVar1 = strlen(s);
  memmove((void *)((long)*(int *)(this + 0x10) + *(long *)this),s,(long)(int)sVar1);
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + (int)sVar1;
  return;
}

Assistant:

void AddString(const char* s) {
    AddSubstring(s, StrLength(s));
  }